

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int __thiscall
capnp::_::OrphanBuilder::copy(OrphanBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  WirePointer *ref;
  SegmentAnd<capnp::word_*> SVar1;
  undefined1 in_stack_00000008 [48];
  SegmentAnd<capnp::word_*> allocation;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *result;
  
  OrphanBuilder(this);
  ref = tagAsPtr(this);
  SVar1 = WireHelpers::setStructPointer
                    ((SegmentBuilder *)0x0,(CapTableBuilder *)src,ref,
                     (StructReader)in_stack_00000008,(BuilderArena *)dst,false);
  this->segment = SVar1.segment;
  this->capTable = (CapTableBuilder *)src;
  this->location = SVar1.value;
  return (int)this;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, StructReader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setStructPointer(
      nullptr, capTable, result.tagAsPtr(), copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value);
  return result;
}